

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_vector_length(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *this;
  uint64_t in_RDX;
  string error;
  operand local_6c [3];
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = label;
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_60,this,in_RDX);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p._0_4_ = 5;
    local_6c[0] = R11;
    local_6c[1] = 0x39;
    local_6c[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_60,local_6c,local_6c + 1,(int *)(local_6c + 2));
    local_60._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_60,&local_40);
    jump_short_if_arg_is_not_block(code,RCX,R11,&local_40);
  }
  local_6c[0] = AH;
  local_6c[1] = 0xb;
  local_6c[2] = 0x39;
  local_60._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_6c,local_6c + 1,local_6c + 2,(unsigned_long *)&local_60);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_vector(code,RCX,R11,&local_40);
  }
  local_60._M_dataplus._M_p._0_4_ = 0x40;
  local_6c[0] = RAX;
  local_6c[1] = 0x1b;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_60,local_6c,local_6c + 1);
  local_6c[0] = ST6;
  local_6c[1] = 0x14;
  local_6c[2] = 0x39;
  local_60._M_dataplus._M_p = (pointer)0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,local_6c,local_6c + 1,local_6c + 2,(long *)&local_60);
  local_60._M_dataplus._M_p._0_4_ = 2;
  local_6c[0] = RAX;
  local_6c[1] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_60,local_6c,local_6c + 1);
  local_60._M_dataplus._M_p._0_4_ = 0x55;
  local_6c[0] = RAX;
  local_6c[1] = 0x39;
  local_6c[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_60,local_6c,local_6c + 1,(int *)(local_6c + 2));
  local_60._M_dataplus._M_p._0_4_ = 0x2c;
  local_6c[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_60,local_6c);
  if (ops->safe_primitives == true) {
    error_label(code,&local_40,re_vector_length_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_vector_length(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_vector(code, asmcode::RCX, asmcode::R11, error);
    }
  //code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::RAX, asmcode::R11);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_vector_length_contract_violation);
    }
  }